

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O3

int mctools_path_is_absolute(mcu8str *rawpath)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  mcu8str path;
  mcu8str local_28;
  
  pcVar4 = rawpath->c_str;
  uVar3 = rawpath->size;
  local_28.buflen = uVar3 + 1;
  local_28.owns_memory = 0;
  local_28.c_str = pcVar4;
  local_28.size = uVar3;
  iVar2 = mctools_impl_has_winnamespace(rawpath);
  if (iVar2 != 0) {
    pcVar4 = pcVar4 + 4;
    uVar3 = uVar3 - 4;
    local_28.c_str = pcVar4;
    local_28.size = uVar3;
  }
  if (uVar3 != 0) {
    if ((uVar3 != 1) && (*pcVar4 == '~')) {
      if (pcVar4[1] == '/') {
        return 1;
      }
      if (pcVar4[1] == '\\') {
        return 1;
      }
    }
    cVar1 = mctools_drive_letter(&local_28);
    uVar3 = (uint)(pcVar4[(ulong)(cVar1 != '\0') * 2] == '\\' ||
                  pcVar4[(ulong)(cVar1 != '\0') * 2] == '/');
  }
  return uVar3;
}

Assistant:

int mctools_path_is_absolute( const mcu8str* rawpath )
  {
    mcu8str path = mctools_impl_view_no_winnamespace(rawpath);
    if ( path.size == 0 )
      return 0;
    if ( path.size >= 2
         && path.c_str[0] == '~'
         && ( path.c_str[1] == '/' || path.c_str[1] == '\\' ) )
      return 1;//leading "~/"
    const char * path_begin = path.c_str;
    if ( mctools_drive_letter( &path ) )
      path_begin += 2;
    if ( *path_begin == '/' || *path_begin == '\\' )
      return 1;
    return 0;
  }